

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscr_storage_vector_based.cpp
# Opt level: O1

void __thiscall
so_5::impl::vector_based_subscr_storage::storage_t::drop_subscription_for_all_states
          (storage_t *this,mbox_t *mbox,type_index *msg_type)

{
  pointer psVar1;
  abstract_message_box_t *paVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  state_t *psVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  agent_t *paVar7;
  long lVar8;
  long lVar9;
  iterator __first;
  pointer psVar10;
  long lVar6;
  
  iVar5 = (*mbox->m_obj->_vptr_abstract_message_box_t[2])();
  lVar6 = CONCAT44(extraout_var,iVar5);
  psVar10 = (this->m_events).
            super__Vector_base<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->m_events).
           super__Vector_base<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar8 = (long)psVar1 - (long)psVar10;
  lVar9 = lVar8 >> 8;
  if (0 < lVar9) {
    lVar9 = lVar9 + 1;
    do {
      iVar5 = (*((psVar10->m_mbox).m_obj)->_vptr_abstract_message_box_t[2])();
      if ((CONCAT44(extraout_var_00,iVar5) == lVar6) &&
         (bVar4 = std::type_index::operator==(&psVar10->m_msg_type,msg_type),
         __first._M_current = psVar10, bVar4)) goto LAB_00201f74;
      iVar5 = (*(psVar10[1].m_mbox.m_obj)->_vptr_abstract_message_box_t[2])();
      if ((CONCAT44(extraout_var_01,iVar5) == lVar6) &&
         (bVar4 = std::type_index::operator==(&psVar10[1].m_msg_type,msg_type), bVar4)) {
        __first._M_current = psVar10 + 1;
        goto LAB_00201f74;
      }
      iVar5 = (*(psVar10[2].m_mbox.m_obj)->_vptr_abstract_message_box_t[2])();
      if ((CONCAT44(extraout_var_02,iVar5) == lVar6) &&
         (bVar4 = std::type_index::operator==(&psVar10[2].m_msg_type,msg_type), bVar4)) {
        __first._M_current = psVar10 + 2;
        goto LAB_00201f74;
      }
      iVar5 = (*(psVar10[3].m_mbox.m_obj)->_vptr_abstract_message_box_t[2])();
      if ((CONCAT44(extraout_var_03,iVar5) == lVar6) &&
         (bVar4 = std::type_index::operator==(&psVar10[3].m_msg_type,msg_type), bVar4)) {
        __first._M_current = psVar10 + 3;
        goto LAB_00201f74;
      }
      psVar10 = psVar10 + 4;
      lVar9 = lVar9 + -1;
    } while (1 < lVar9);
  }
  lVar9 = (long)psVar1 - (long)psVar10 >> 6;
  if (lVar9 != 1) {
    if (lVar9 != 2) {
      __first._M_current = psVar1;
      if ((lVar9 != 3) ||
         ((iVar5 = (*((psVar10->m_mbox).m_obj)->_vptr_abstract_message_box_t[2])(),
          CONCAT44(extraout_var_04,iVar5) == lVar6 &&
          (bVar4 = std::type_index::operator==(&psVar10->m_msg_type,msg_type),
          __first._M_current = psVar10, bVar4)))) goto LAB_00201f74;
      psVar10 = psVar10 + 1;
    }
    iVar5 = (*((psVar10->m_mbox).m_obj)->_vptr_abstract_message_box_t[2])();
    if ((CONCAT44(extraout_var_05,iVar5) == lVar6) &&
       (bVar4 = std::type_index::operator==(&psVar10->m_msg_type,msg_type),
       __first._M_current = psVar10, bVar4)) goto LAB_00201f74;
    psVar10 = psVar10 + 1;
  }
  iVar5 = (*((psVar10->m_mbox).m_obj)->_vptr_abstract_message_box_t[2])();
  __first._M_current = psVar1;
  if ((CONCAT44(extraout_var_06,iVar5) == lVar6) &&
     (bVar4 = std::type_index::operator==(&psVar10->m_msg_type,msg_type),
     __first._M_current = psVar10, !bVar4)) {
    __first._M_current = psVar1;
  }
LAB_00201f74:
  psVar10 = __first._M_current + 1;
  if (psVar10 != psVar1 && __first._M_current != psVar1) {
    do {
      iVar5 = (*((psVar10->m_mbox).m_obj)->_vptr_abstract_message_box_t[2])();
      if ((CONCAT44(extraout_var_07,iVar5) != lVar6) ||
         (bVar4 = std::type_index::operator==(&psVar10->m_msg_type,msg_type), !bVar4)) {
        intrusive_ptr_t<so_5::abstract_message_box_t>::operator=
                  (&(__first._M_current)->m_mbox,&psVar10->m_mbox);
        psVar3 = psVar10->m_state;
        ((__first._M_current)->m_msg_type)._M_target = (psVar10->m_msg_type)._M_target;
        (__first._M_current)->m_state = psVar3;
        std::function<void_(so_5::invocation_type_t,_so_5::intrusive_ptr_t<so_5::message_t>_&)>::
        operator=(&((__first._M_current)->m_handler).m_method,&(psVar10->m_handler).m_method);
        ((__first._M_current)->m_handler).m_thread_safety = (psVar10->m_handler).m_thread_safety;
        __first._M_current = __first._M_current + 1;
      }
      psVar10 = psVar10 + 1;
    } while (psVar10 != psVar1);
  }
  std::
  vector<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
  ::_M_erase(&this->m_events,__first,
             (this->m_events).
             super__Vector_base<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if (lVar8 != (long)(this->m_events).
                     super__Vector_base<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_events).
                     super__Vector_base<so_5::impl::subscription_storage_common::subscr_info_t,_std::allocator<so_5::impl::subscription_storage_common::subscr_info_t>_>
                     ._M_impl.super__Vector_impl_data._M_start) {
    paVar2 = mbox->m_obj;
    paVar7 = subscription_storage_t::owner(&this->super_subscription_storage_t);
    UNRECOVERED_JUMPTABLE = paVar2->_vptr_abstract_message_box_t[4];
    (*UNRECOVERED_JUMPTABLE)(paVar2,msg_type,paVar7,UNRECOVERED_JUMPTABLE);
    return;
  }
  return;
}

Assistant:

void
storage_t::drop_subscription_for_all_states(
	const mbox_t & mbox,
	const std::type_index & msg_type )
	{
		using namespace std;

		const auto mbox_id = mbox->id();

		const auto old_size = m_events.size();

		m_events.erase(
				remove_if( begin( m_events ), end( m_events ),
						[mbox_id, &msg_type]( const info_t & i ) {
							return i.m_mbox->id() == mbox_id &&
									i.m_msg_type == msg_type;
						} ),
				end( m_events ) );

		// Note: since v.5.5.9 mbox unsubscription is initiated even if
		// it is MPSC mboxes. It is important for the case of message
		// delivery tracing.

		if( old_size != m_events.size() )
			mbox->unsubscribe_event_handlers( msg_type, owner() );
	}